

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

string * cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation
                   (string *__return_storage_ptr__,ExtPrivkey *ext_privkey,string *child_path)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  long *plVar4;
  long *plVar5;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ByteData local_60;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = ExtPrivkey::IsValid(ext_privkey);
  if (bVar2) {
    ExtPrivkey::GetFingerprintData(&local_60,ext_privkey);
    ByteData::GetHex_abi_cxx11_(&local_48,&local_60);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x219463);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_70 = *plVar5;
      lStack_68 = plVar4[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar5;
      local_80 = (long *)*plVar4;
    }
    local_78 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (child_path->_M_string_length != 0) {
      pbVar1 = (byte *)(child_path->_M_dataplus)._M_p;
      bVar3 = *pbVar1;
      if ((bVar3 | 0x20) == 0x6d) {
        bVar3 = pbVar1[1];
      }
      if (bVar3 != 0x2f) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::substr((ulong)&local_80,(ulong)child_path);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyInfo::GetExtPrivkeyInformation(
    const ExtPrivkey& ext_privkey, const std::string& child_path) {
  std::string result;
  if (ext_privkey.IsValid()) {
    result = "[" + ext_privkey.GetFingerprintData().GetHex();
    if (!child_path.empty()) {
      std::string::size_type index = 0;
      if ((child_path[0] == 'm') || (child_path[0] == 'M')) ++index;
      if (child_path[index] != '/') {
        result += "/";
      }
      result += child_path.substr(index);
    }
    result += "]";
  }
  return result;
}